

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::VarConvertToNumber_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  Var pvVar1;
  RecyclableObject *value;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == VarConvertToNumberActionTag) {
    pvVar1 = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (pvVar1 != (Var)0x0) {
      if ((ulong)pvVar1 >> 0x30 == 0) {
        value = Js::VarTo<Js::RecyclableObject>(pvVar1);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          pvVar1 = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
      }
      pvVar1 = Js::JavascriptOperators::ToNumber(pvVar1,scriptContext);
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)29>
                (executeContext,evt,pvVar1);
      return;
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void VarConvertToNumber_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::VarConvertToNumberActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(var, ctx);

            Js::Var res = Js::JavascriptOperators::ToNumber(var, ctx);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::VarConvertToNumberActionTag>(executeContext, evt, res);
        }